

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

bool P_Thing_Move(int tid,AActor *source,int mapspot,bool fog)

{
  bool bVar1;
  AActor *pAVar2;
  DVector3 local_18;
  
  if (tid != 0) {
    for (source = AActor::TIDHash[tid & 0x7f]; source != (AActor *)0x0; source = source->inext) {
      if (source->tid == tid) goto LAB_0045a9fb;
    }
    source = (AActor *)0x0;
  }
LAB_0045a9fb:
  if (mapspot != 0) {
    for (pAVar2 = AActor::TIDHash[mapspot & 0x7f]; pAVar2 != (AActor *)0x0; pAVar2 = pAVar2->inext)
    {
      if (pAVar2->tid == mapspot) {
        if (source == (AActor *)0x0) {
          return false;
        }
        local_18.X = (pAVar2->__Pos).X;
        local_18.Y = (pAVar2->__Pos).Y;
        local_18.Z = (pAVar2->__Pos).Z;
        bVar1 = P_MoveThing(source,&local_18,fog);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool P_Thing_Move (int tid, AActor *source, int mapspot, bool fog)
{
	AActor *target;

	if (tid != 0)
	{
		FActorIterator iterator1(tid);
		source = iterator1.Next();
	}
	FActorIterator iterator2 (mapspot);
	target = iterator2.Next ();

	if (source != NULL && target != NULL)
	{
		return P_MoveThing(source, target->Pos(), fog);
	}
	return false;
}